

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_voice.c
# Opt level: O1

_Bool al_set_voice_position(ALLEGRO_VOICE *voice,uint val)

{
  int iVar1;
  _Bool _Var2;
  
  if ((voice->attached_stream == (ALLEGRO_SAMPLE_INSTANCE *)0x0) || (voice->is_streaming != false))
  {
    _Var2 = false;
  }
  else {
    al_lock_mutex(voice->mutex);
    iVar1 = (*voice->driver->set_voice_position)(voice,val);
    _Var2 = iVar1 == 0;
    al_unlock_mutex(voice->mutex);
  }
  return _Var2;
}

Assistant:

bool al_set_voice_position(ALLEGRO_VOICE *voice, unsigned int val)
{
   ASSERT(voice);

   if (voice->attached_stream && !voice->is_streaming) {
      bool ret;
      al_lock_mutex(voice->mutex);
      // XXX change method
      ret = voice->driver->set_voice_position(voice, val) == 0;
      al_unlock_mutex(voice->mutex);
      return ret;
   }

   return false;
}